

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
PlayersIRCCommand::trigger
          (PlayersIRCCommand *this,IRC_Bot *source,string_view channel,string_view param_3,
          string_view param_4)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  size_type sVar4;
  size_type sVar5;
  undefined8 uVar6;
  size_type sVar7;
  pointer pPVar8;
  size_type sVar9;
  char *pcVar10;
  reference pvVar11;
  const_pointer pvVar12;
  const_pointer pvVar13;
  char *pcVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  __sv_type _Var17;
  basic_string_view<char,_std::char_traits<char>_> bVar18;
  size_type in_stack_fffffffffffff9d8;
  undefined4 uVar19;
  size_t local_438;
  char *local_430;
  size_t local_418;
  char *local_410;
  size_t local_3f8;
  char *local_3f0;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  undefined1 local_2f8 [8];
  string out;
  char *local_2d0;
  size_t local_2b8;
  char *local_2b0;
  size_t local_298;
  char *local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined4 local_1ac;
  undefined1 local_1a8 [8];
  string name;
  _Self local_180;
  iterator node;
  uint oBots;
  uint nBots;
  uint gBots;
  uint oTotal;
  uint nTotal;
  uint gTotal;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oStrings;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nStrings;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gStrings;
  string local_108;
  __sv_type local_e8;
  size_t local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d0;
  uint64_t local_c0;
  Server *server;
  uint i;
  bool noServers;
  string_view oTeam;
  string_view nTeam;
  string_view gTeam;
  string_view oTeamColor;
  string_view nTeamColor;
  string_view gTeamColor;
  int type;
  IRC_Bot *source_local;
  PlayersIRCCommand *this_local;
  string_view param_3_local;
  string_view channel_local;
  
  pcVar14 = channel._M_str;
  sVar15 = channel._M_len;
  Jupiter::IRC::Client::getChannel(source,sVar15,pcVar14);
  Jupiter::IRC::Client::Channel::getType();
  nTeamColor._M_str = (char *)RenX::getTeamColor(GDI);
  auVar16 = RenX::getTeamColor(Nod);
  nTeamColor._M_len = auVar16._8_8_;
  oTeamColor._M_str = auVar16._0_8_;
  auVar16 = RenX::getTeamColor(Other);
  oTeamColor._M_len = auVar16._8_8_;
  gTeam._M_str = auVar16._0_8_;
  auVar16 = RenX::getTeamName(GDI);
  gTeam._M_len = auVar16._8_8_;
  nTeam._M_str = auVar16._0_8_;
  auVar16 = RenX::getTeamName(Nod);
  nTeam._M_len = auVar16._8_8_;
  oTeam._M_str = auVar16._0_8_;
  auVar16 = RenX::getTeamName(Other);
  server._7_1_ = 1;
  server._0_4_ = 0;
  do {
    oTeam._M_len = auVar16._8_8_;
    _i = auVar16._0_8_;
    uVar3 = (ulong)(uint)server;
    RenX::getCore();
    uVar2 = RenX::Core::getServerCount();
    if (uVar3 == uVar2) {
      if ((server._7_1_ & 1) != 0) {
        bVar18 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
        local_438 = bVar18._M_len;
        local_430 = bVar18._M_str;
        Jupiter::IRC::Client::sendMessage(source,sVar15,pcVar14,local_438,local_430);
      }
      return;
    }
    uVar3 = RenX::getCore();
    local_c0 = RenX::Core::getServer(uVar3);
    uVar3 = RenX::Server::isLogChanType((int)local_c0);
    if ((uVar3 & 1) != 0) {
      server._7_1_ = 0;
      sVar4 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                        ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                         (local_c0 + 0x10));
      sVar5 = RenX::Server::getBotCount();
      if (sVar4 == sVar5) {
        bVar18 = sv("No players are in-game.",0x17);
        local_418 = bVar18._M_len;
        local_410 = bVar18._M_str;
        Jupiter::IRC::Client::sendMessage(source,sVar15,pcVar14,local_418,local_410);
      }
      else {
        sVar4 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                          ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                           (local_c0 + 0x10));
        if (sVar4 == 0) {
          local_d8 = sVar15;
          aStack_d0._M_allocated_capacity = (size_type)pcVar14;
          uVar6 = RenX::Server::getBotCount();
          string_printf_abi_cxx11_(&local_108,"ERROR: NO PLAYERS BUT BOT_COUNT = %u.",uVar6);
          local_e8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_108);
          Jupiter::IRC::Client::sendMessage
                    (source,local_d8,aStack_d0._M_allocated_capacity,local_e8._M_len,local_e8._M_str
                    );
          std::__cxx11::string::~string((string *)&local_108);
        }
        else {
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&nStrings.
                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl._M_node._M_size);
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&oStrings.
                     super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl._M_node._M_size);
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&nTotal);
          oTotal = 0;
          gBots = 0;
          nBots = 0;
          oBots = 0;
          node._M_node._4_4_ = 0;
          node._M_node._0_4_ = 0;
          local_180._M_node =
               (_List_node_base *)
               std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                         ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                          (local_c0 + 0x10));
          while( true ) {
            name.field_2._8_8_ =
                 std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                           ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                            (local_c0 + 0x10));
            bVar1 = std::operator==(&local_180,(_Self *)((long)&name.field_2 + 8));
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            std::_List_iterator<RenX::PlayerInfo>::operator*(&local_180);
            RenX::getFormattedPlayerName_abi_cxx11_((PlayerInfo *)local_1a8);
            sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1a8);
            if (sVar7 < 0xd1) {
              pPVar8 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_180);
              if (pPVar8->team == GDI) {
                bVar1 = std::__cxx11::
                        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&nStrings.
                                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl._M_node._M_size);
                if (bVar1) {
LAB_00141ebd:
                  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                    ((basic_string_view<char,_std::char_traits<char>_> *)
                                     &nTeamColor._M_str);
                  pvVar12 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       &nTeamColor._M_str);
                  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                    ((basic_string_view<char,_std::char_traits<char>_> *)
                                     &nTeam._M_str);
                  pvVar13 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       &nTeam._M_str);
                  in_stack_fffffffffffff9d8 =
                       std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1a8);
                  pcVar10 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1a8);
                  string_printf_abi_cxx11_
                            (&local_210,"\x03%.*s[%.*s]: \x02%.*s\x02",sVar4,pvVar12,sVar5,pvVar13,
                             in_stack_fffffffffffff9d8,pcVar10);
                  std::__cxx11::
                  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&nStrings.
                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl._M_node._M_size,&local_210);
                  std::__cxx11::string::~string((string *)&local_210);
                }
                else {
                  pvVar11 = std::__cxx11::
                            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&nStrings.
                                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl._M_node._M_size);
                  sVar7 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                    (pvVar11);
                  sVar9 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1a8);
                  if (0xf0 < sVar7 + sVar9) goto LAB_00141ebd;
                  sVar7 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1a8);
                  pcVar10 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1a8);
                  string_printf_abi_cxx11_(&local_230,"\x03, \x02%.*s\x02",sVar7,pcVar10);
                  pvVar11 = std::__cxx11::
                            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&nStrings.
                                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl._M_node._M_size);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator+=(pvVar11,&local_230);
                  std::__cxx11::string::~string((string *)&local_230);
                }
                oTotal = oTotal + 1;
                pPVar8 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_180);
                if ((pPVar8->isBot & 1U) != 0) {
                  oBots = oBots + 1;
                }
              }
              else if (pPVar8->team == Nod) {
                bVar1 = std::__cxx11::
                        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&oStrings.
                                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl._M_node._M_size);
                if (bVar1) {
LAB_00141c7c:
                  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                    ((basic_string_view<char,_std::char_traits<char>_> *)
                                     &oTeamColor._M_str);
                  pvVar12 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       &oTeamColor._M_str);
                  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                    ((basic_string_view<char,_std::char_traits<char>_> *)
                                     &oTeam._M_str);
                  pvVar13 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       &oTeam._M_str);
                  in_stack_fffffffffffff9d8 =
                       std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1a8);
                  pcVar10 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1a8);
                  string_printf_abi_cxx11_
                            (&local_1d0,"\x03%.*s[%.*s]: \x02%.*s\x02",sVar4,pvVar12,sVar5,pvVar13,
                             in_stack_fffffffffffff9d8,pcVar10);
                  std::__cxx11::
                  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&oStrings.
                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl._M_node._M_size,&local_1d0);
                  std::__cxx11::string::~string((string *)&local_1d0);
                }
                else {
                  pvVar11 = std::__cxx11::
                            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&oStrings.
                                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl._M_node._M_size);
                  sVar7 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                    (pvVar11);
                  sVar9 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1a8);
                  if (0xf0 < sVar7 + sVar9) goto LAB_00141c7c;
                  sVar7 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1a8);
                  pcVar10 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1a8);
                  string_printf_abi_cxx11_(&local_1f0,"\x03, \x02%.*s\x02",sVar7,pcVar10);
                  pvVar11 = std::__cxx11::
                            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&oStrings.
                                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl._M_node._M_size);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator+=(pvVar11,&local_1f0);
                  std::__cxx11::string::~string((string *)&local_1f0);
                }
                gBots = gBots + 1;
                pPVar8 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_180);
                if ((pPVar8->isBot & 1U) != 0) {
                  node._M_node._4_4_ = node._M_node._4_4_ + 1;
                }
              }
              else {
                bVar1 = std::__cxx11::
                        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&nTotal);
                if (bVar1) {
LAB_001420e7:
                  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                    ((basic_string_view<char,_std::char_traits<char>_> *)
                                     &gTeam._M_str);
                  pvVar12 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       &gTeam._M_str);
                  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                    ((basic_string_view<char,_std::char_traits<char>_> *)&i);
                  pvVar13 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                      ((basic_string_view<char,_std::char_traits<char>_> *)&i);
                  in_stack_fffffffffffff9d8 =
                       std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1a8);
                  pcVar10 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1a8);
                  string_printf_abi_cxx11_
                            (&local_250,"\x03%.*s[%.*s]: \x02%.*s\x02",sVar4,pvVar12,sVar5,pvVar13,
                             in_stack_fffffffffffff9d8,pcVar10);
                  std::__cxx11::
                  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&nTotal,&local_250);
                  std::__cxx11::string::~string((string *)&local_250);
                }
                else {
                  pvVar11 = std::__cxx11::
                            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&nTotal);
                  sVar7 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                    (pvVar11);
                  sVar9 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1a8);
                  if (0xf0 < sVar7 + sVar9) goto LAB_001420e7;
                  sVar7 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1a8);
                  pcVar10 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1a8);
                  string_printf_abi_cxx11_(&local_270,"\x03, \x02%.*s\x02",sVar7,pcVar10);
                  pvVar11 = std::__cxx11::
                            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&nTotal);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator+=(pvVar11,&local_270);
                  std::__cxx11::string::~string((string *)&local_270);
                }
                nBots = nBots + 1;
                pPVar8 = std::_List_iterator<RenX::PlayerInfo>::operator->(&local_180);
                if ((pPVar8->isBot & 1U) != 0) {
                  node._M_node._0_4_ = (uint)node._M_node + 1;
                }
              }
              local_1ac = 0;
            }
            else {
              local_1ac = 7;
            }
            std::__cxx11::string::~string((string *)local_1a8);
            std::_List_iterator<RenX::PlayerInfo>::operator++(&local_180);
          }
          while (sVar4 = std::__cxx11::
                         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&nStrings.
                                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl._M_node._M_size), sVar4 != 0) {
            pvVar11 = std::__cxx11::
                      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&nStrings.
                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl._M_node._M_size);
            _Var17 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar11);
            local_298 = _Var17._M_len;
            local_290 = _Var17._M_str;
            Jupiter::IRC::Client::sendMessage(source,sVar15,pcVar14,local_298,local_290);
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&nStrings.
                            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl._M_node._M_size);
          }
          while (sVar4 = std::__cxx11::
                         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&oStrings.
                                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl._M_node._M_size), sVar4 != 0) {
            pvVar11 = std::__cxx11::
                      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&oStrings.
                                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl._M_node._M_size);
            _Var17 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar11);
            local_2b8 = _Var17._M_len;
            local_2b0 = _Var17._M_str;
            Jupiter::IRC::Client::sendMessage(source,sVar15,pcVar14,local_2b8,local_2b0);
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&oStrings.
                            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl._M_node._M_size);
          }
          while (sVar4 = std::__cxx11::
                         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&nTotal), sVar4 != 0) {
            pvVar11 = std::__cxx11::
                      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&nTotal);
            join_0x00000010_0x00000000_ =
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar11);
            Jupiter::IRC::Client::sendMessage(source,sVar15,pcVar14,out.field_2._8_8_,local_2d0);
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&nTotal);
          }
          sVar4 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                            ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                             (local_c0 + 0x10));
          string_printf_abi_cxx11_((string *)local_2f8,"\x0303Total Players\x03: %u",sVar4);
          if (oBots + node._M_node._4_4_ + (uint)node._M_node != 0) {
            string_printf_abi_cxx11_
                      (&local_318," (%u bots)",
                       (ulong)(oBots + node._M_node._4_4_ + (uint)node._M_node));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2f8,&local_318);
            std::__cxx11::string::~string((string *)&local_318);
          }
          uVar19 = (undefined4)(in_stack_fffffffffffff9d8 >> 0x20);
          if (oTotal != 0) {
            sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               &nTeamColor._M_str);
            pvVar12 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 &nTeamColor._M_str);
            sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                              ((basic_string_view<char,_std::char_traits<char>_> *)&nTeam._M_str);
            pvVar13 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                ((basic_string_view<char,_std::char_traits<char>_> *)&nTeam._M_str);
            in_stack_fffffffffffff9d8 = CONCAT44(uVar19,oTotal);
            string_printf_abi_cxx11_
                      (&local_338,"\x0302 | \x03%.*s%.*s\x03: %u",sVar4,pvVar12,sVar5,pvVar13,
                       in_stack_fffffffffffff9d8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2f8,&local_338);
            std::__cxx11::string::~string((string *)&local_338);
            if (oBots != 0) {
              string_printf_abi_cxx11_(&local_358," (%u bots)",(ulong)oBots);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2f8,&local_358);
              std::__cxx11::string::~string((string *)&local_358);
            }
          }
          uVar19 = (undefined4)(in_stack_fffffffffffff9d8 >> 0x20);
          if (gBots != 0) {
            sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               &oTeamColor._M_str);
            pvVar12 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 &oTeamColor._M_str);
            sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                              ((basic_string_view<char,_std::char_traits<char>_> *)&oTeam._M_str);
            pvVar13 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                ((basic_string_view<char,_std::char_traits<char>_> *)&oTeam._M_str);
            in_stack_fffffffffffff9d8 = CONCAT44(uVar19,gBots);
            string_printf_abi_cxx11_
                      (&local_378,"\x0302 | \x03%.*s%.*s\x03: %u",sVar4,pvVar12,sVar5,pvVar13,
                       in_stack_fffffffffffff9d8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2f8,&local_378);
            std::__cxx11::string::~string((string *)&local_378);
            if (node._M_node._4_4_ != 0) {
              string_printf_abi_cxx11_(&local_398," (%u bots)",(ulong)node._M_node._4_4_);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2f8,&local_398);
              std::__cxx11::string::~string((string *)&local_398);
            }
          }
          uVar19 = (undefined4)(in_stack_fffffffffffff9d8 >> 0x20);
          if (nBots != 0) {
            sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                              ((basic_string_view<char,_std::char_traits<char>_> *)&gTeam._M_str);
            pvVar12 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                ((basic_string_view<char,_std::char_traits<char>_> *)&gTeam._M_str);
            sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                              ((basic_string_view<char,_std::char_traits<char>_> *)&i);
            pvVar13 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                ((basic_string_view<char,_std::char_traits<char>_> *)&i);
            in_stack_fffffffffffff9d8 = CONCAT44(uVar19,nBots);
            string_printf_abi_cxx11_
                      (&local_3b8,"\x0302 | \x03%.*s%.*s\x03: %u",sVar4,pvVar12,sVar5,pvVar13,
                       in_stack_fffffffffffff9d8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2f8,&local_3b8);
            std::__cxx11::string::~string((string *)&local_3b8);
            if ((uint)node._M_node != 0) {
              string_printf_abi_cxx11_(&local_3d8," (%u bots)",(ulong)(uint)node._M_node);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2f8,&local_3d8);
              std::__cxx11::string::~string((string *)&local_3d8);
            }
          }
          _Var17 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2f8);
          local_3f8 = _Var17._M_len;
          local_3f0 = _Var17._M_str;
          Jupiter::IRC::Client::sendMessage(source,sVar15,pcVar14,local_3f8,local_3f0);
          std::__cxx11::string::~string((string *)local_2f8);
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&nTotal);
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&oStrings.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl._M_node._M_size);
          std::__cxx11::
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&nStrings.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl._M_node._M_size);
        }
      }
    }
    auVar16._8_8_ = oTeam._M_len;
    auVar16._0_8_ = _i;
    server._0_4_ = (uint)server + 1;
  } while( true );
}

Assistant:

void PlayersIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view , std::string_view )
{
	int type = source->getChannel(channel)->getType();

	// Team colors
	std::string_view gTeamColor = RenX::getTeamColor(RenX::TeamType::GDI);
	std::string_view nTeamColor = RenX::getTeamColor(RenX::TeamType::Nod);
	std::string_view oTeamColor = RenX::getTeamColor(RenX::TeamType::Other);

	// Team names
	std::string_view gTeam = RenX::getTeamName(RenX::TeamType::GDI);
	std::string_view nTeam = RenX::getTeamName(RenX::TeamType::Nod);
	std::string_view oTeam = RenX::getTeamName(RenX::TeamType::Other);

	bool noServers = true;
	for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
	{
		RenX::Server *server = RenX::getCore()->getServer(i);
		if (server->isLogChanType(type))
		{
			noServers = false;
			if (server->players.size() != server->getBotCount())
			{
				if (server->players.size() == 0)
				{
					source->sendMessage(channel, string_printf("ERROR: NO PLAYERS BUT BOT_COUNT = %u.", server->getBotCount()));
					continue;
				}

				// End string containers
				std::list<std::string> gStrings;
				std::list<std::string> nStrings;
				std::list<std::string> oStrings;

				// Team player counters
				unsigned int gTotal = 0;
				unsigned int nTotal = 0;
				unsigned int oTotal = 0;

				// Bot counters
				unsigned int gBots = 0;
				unsigned int nBots = 0;
				unsigned int oBots = 0;

				for (auto node = server->players.begin(); node != server->players.end(); ++node) {
					std::string name = RenX::getFormattedPlayerName(*node);
					if (name.size() > STRING_LENGTH - 32) continue; // Name will be too long to send.

					switch (node->team) {
					case RenX::TeamType::Nod:
						if (nStrings.empty() || nStrings.back().size() + name.size() > STRING_LENGTH) {
							nStrings.push_back(string_printf(IRCCOLOR "%.*s[%.*s]: " IRCBOLD "%.*s" IRCBOLD,
								nTeamColor.size(), nTeamColor.data(),
								nTeam.size(), nTeam.data(),
								name.size(), name.data()));
						}
						else {
							nStrings.back() += string_printf(IRCCOLOR ", " IRCBOLD "%.*s" IRCBOLD, name.size(), name.data());
						}

						++nTotal;
						if (node->isBot) {
							++nBots;
						}
						break;
					case RenX::TeamType::GDI:
						if (gStrings.empty() || gStrings.back().size() + name.size() > STRING_LENGTH)
						{
							gStrings.push_back(string_printf(IRCCOLOR "%.*s[%.*s]: " IRCBOLD "%.*s" IRCBOLD,
								gTeamColor.size(), gTeamColor.data(),
								gTeam.size(), gTeam.data(),
								name.size(), name.data()));
						}
						else {
							gStrings.back() += string_printf(IRCCOLOR ", " IRCBOLD "%.*s" IRCBOLD, name.size(), name.data());
						}

						++gTotal;
						if (node->isBot) {
							++gBots;
						}
						break;
					default:
						if (oStrings.empty() || oStrings.back().size() + name.size() > STRING_LENGTH) {
							oStrings.push_back(string_printf(IRCCOLOR "%.*s[%.*s]: " IRCBOLD "%.*s" IRCBOLD,
								oTeamColor.size(), oTeamColor.data(),
								oTeam.size(), oTeam.data(),
								name.size(), name.data()));
						}
						else {
							oStrings.back() += string_printf(IRCCOLOR ", " IRCBOLD "%.*s" IRCBOLD, name.size(), name.data());
						}

						++oTotal;
						if (node->isBot) {
							++oBots;
						}
						break;
					}
				}
				while (gStrings.size() != 0) {
					source->sendMessage(channel, gStrings.front());
					gStrings.pop_front();
				}
				while (nStrings.size() != 0) {
					source->sendMessage(channel, nStrings.front());
					nStrings.pop_front();
				}
				while (oStrings.size() != 0) {
					source->sendMessage(channel, oStrings.front());
					oStrings.pop_front();
				}

				std::string out = string_printf(IRCCOLOR "03Total Players" IRCCOLOR ": %u", server->players.size());
				if (gBots + nBots + oBots > 0) {
					out += string_printf(" (%u bots)", gBots + nBots + oBots);
				}
				if (gTotal > 0) {
					out += string_printf(IRCCOLOR "02 | " IRCCOLOR "%.*s%.*s" IRCCOLOR ": %u", gTeamColor.size(),
						gTeamColor.data(), gTeam.size(),
						gTeam.data(), gTotal);
					if (gBots > 0)
						out += string_printf(" (%u bots)", gBots);
				}
				if (nTotal > 0) {
					out += string_printf(IRCCOLOR "02 | " IRCCOLOR "%.*s%.*s" IRCCOLOR ": %u", nTeamColor.size(),
						nTeamColor.data(), nTeam.size(),
						nTeam.data(), nTotal);
					if (nBots > 0)
						out += string_printf(" (%u bots)", nBots);
				}
				if (oTotal > 0) {
					out += string_printf(IRCCOLOR "02 | " IRCCOLOR "%.*s%.*s" IRCCOLOR ": %u", oTeamColor.size(),
						oTeamColor.data(), oTeam.size(),
						oTeam.data(), oTotal);
					if (oBots > 0)
						out += string_printf(" (%u bots)", oBots);
				}
				source->sendMessage(channel, out);
			}
			else
				source->sendMessage(channel, "No players are in-game."sv);
		}
	}
	if (noServers)
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
}